

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsShare(octet *si,size_t count,size_t threshold,size_t len,octet *s,octet *m0,octet *mi,
               gen_i rng,void *rng_state)

{
  bool_t bVar1;
  ulong n_00;
  word *pwVar2;
  u64 *dest;
  size_t sVar3;
  word *a;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  void *in_RDI;
  void *in_R8;
  word *in_R9;
  void *in_stack_00000008;
  code *in_stack_00000010;
  void *stack;
  word *c;
  word *k;
  word *f;
  void *state;
  size_t i;
  size_t n;
  void *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff90;
  word *n_01;
  size_t in_stack_ffffffffffffff98;
  word *a_00;
  word *c_00;
  err_t local_4;
  
  if (in_stack_00000010 == (code *)0x0) {
    local_4 = 0x130;
  }
  else {
    if ((((((in_RCX == (word *)0x10) || (in_RCX == (word *)0x18)) || (in_RCX == (word *)0x20)) &&
         ((in_RDX != (word *)0x0 && (in_RDX <= in_RSI)))) &&
        ((bVar1 = memIsValid(in_R8,(size_t)in_RCX), bVar1 != 0 &&
         ((bVar1 = memIsValid(in_R9,(size_t)in_RCX), bVar1 != 0 &&
          (bVar1 = memIsValid(in_stack_00000008,(long)in_RCX * (long)in_RSI), bVar1 != 0)))))) &&
       (bVar1 = memIsValid(in_RDI,(long)in_RSI * (long)in_RCX), bVar1 != 0)) {
      n_00 = (long)in_RCX + 7U >> 3;
      pwVar2 = (word *)(((long)in_RDX * 2 * n_00 + 1) * 8);
      dest = (u64 *)ppMul_deep(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      sVar3 = ppMod_deep((size_t)dest,(size_t)in_stack_ffffffffffffff78);
      utilMax(2,dest,sVar3);
      a = (word *)blobCreate((size_t)in_stack_ffffffffffffff78);
      if (a == (word *)0x0) {
        return 0x6e;
      }
      c_00 = a + n_00 + 1;
      a_00 = c_00 + ((long)in_RDX * n_00 - n_00);
      n_01 = a_00 + (long)in_RDX * n_00;
      (*in_stack_00000010)(c_00,(long)in_RDX * (long)in_RCX - (long)in_RCX,stack);
      u64From(dest,in_stack_ffffffffffffff78,0x14634a);
      u64From(dest,in_stack_ffffffffffffff78,0x14635e);
      ppMul(c_00,a_00,(size_t)n_01,pwVar2,(size_t)dest,in_stack_ffffffffffffff78);
      wwXor2(a_00 + n_00,c_00,(long)in_RDX * n_00 - n_00);
      u64From(dest,in_stack_ffffffffffffff78,0x1463cb);
      wwXor2(a_00,a,n_00);
      for (pwVar2 = (word *)0x0; pwVar2 < in_RSI; pwVar2 = (word *)((long)pwVar2 + 1)) {
        u64From(dest,in_stack_ffffffffffffff78,0x14641d);
        a[n_00] = 1;
        ppMod(in_RDX,in_RCX,(size_t)in_R8,in_R9,n_00,pwVar2);
        u64To(dest,(size_t)in_stack_ffffffffffffff78,(u64 *)0x14647e);
      }
      blobClose((blob_t)0x14649b);
      return 0;
    }
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsShare(octet si[], size_t count, size_t threshold, size_t len, 
	const octet s[], const octet m0[], const octet mi[], 
	gen_i rng, void* rng_state)
{
	size_t n, i;
	void* state;
	word* f;
	word* k;
	word* c;
	void* stack;
	// проверить генератор
	if (rng == 0)
		return ERR_BAD_RNG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		threshold == 0 || count < threshold ||
		!memIsValid(s, len) || !memIsValid(m0, len) || 
		!memIsValid(mi, len * count) || !memIsValid(si, count * len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * threshold * n + 1) + 
		utilMax(2, 
			ppMul_deep(threshold * n - n, n),
			ppMod_deep(threshold * n, n + 1)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	k = f + n + 1;
	c = k + threshold * n - n;
	stack = c + threshold * n;
	// сгенерировать k
	rng(k, threshold * len - len, rng_state);
	wwFrom(k, k, threshold * len - len);
	// c(x) <- (x^l + m0(x))k(x) + s(x)
	wwFrom(f, m0, len);
	ppMul(c, k, threshold * n - n, f, n, stack);
	wwXor2(c + n, k, threshold * n - n);
	wwFrom(f, s, len);
	wwXor2(c, f, n);
	// цикл по пользователям
	for (i = 0; i < count; ++i)
	{
		// f(x) <- x^l + mi(x)
		EXPECT(belsValM(mi + i * len, len) == ERR_OK);
		wwFrom(f, mi + i * len, len);
		f[n] = 1;
		// si(x) <- c(x) mod f(x)
		ppMod(f, c, threshold * n, f, n + 1, stack);
		wwTo(si + i * len, len, f);
	}
	// завершение
	blobClose(state);
	return ERR_OK;
}